

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O0

switch_strings * __thiscall
pstore::command_line::details::get_switch_strings_abi_cxx11_
          (switch_strings *__return_storage_ptr__,details *this,options_set *ops)

{
  unsigned_long uVar1;
  small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
  *this_00;
  details *this_01;
  bool bVar2;
  not_null *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar3;
  unsigned_long *puVar4;
  option *op_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_108;
  undefined4 local_dc;
  string local_d8 [32];
  unsigned_long *local_b8;
  unsigned_long *prev_code_points;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prev_string;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *prev;
  small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
  *local_98;
  mapped_type *v;
  alias *alias;
  undefined1 local_78 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  name;
  option *op;
  iterator __end2;
  iterator __begin2;
  options_set *__range2;
  size_t separator_len;
  details *pdStack_18;
  char separator [3];
  options_set *ops_local;
  switch_strings *names;
  
  separator_len._5_2_ = 0x202c;
  separator_len._7_1_ = 0;
  pdStack_18 = this;
  std::
  map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
  ::map(__return_storage_ptr__);
  this_01 = pdStack_18;
  __end2 = std::
           set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
           ::begin((set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
                    *)pdStack_18);
  op = (option *)
       std::
       set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
       ::end((set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
              *)this_01);
  do {
    bVar2 = std::operator!=(&__end2,(_Self *)&op);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    this_02 = (not_null *)
              std::
              _Rb_tree_const_iterator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>
              ::operator*(&__end2);
    name.second = (unsigned_long)gsl::not_null::operator_cast_to_option_(this_02);
    (anonymous_namespace)::option_string_abi_cxx11_
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)local_78,(_anonymous_namespace_ *)name.second,op_00);
    str = std::get<std::__cxx11::string,unsigned_long>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                      *)local_78);
    sVar3 = utf::length(str);
    puVar4 = std::get<unsigned_long,std::__cxx11::string>
                       ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                         *)local_78);
    if (sVar3 != *puVar4) {
      assert_failed("pstore::utf::length (std::get<std::string> (name)) == std::get<std::size_t> (name)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
                    ,0x8b);
    }
    v = (mapped_type *)(**(code **)(*(long *)name.second + 0x60))();
    if ((alias *)v != (alias *)0x0) {
      name.second = (unsigned_long)command_line::alias::original((alias *)v);
    }
    gsl::not_null<const_pstore::command_line::option_*>::not_null
              ((not_null<const_pstore::command_line::option_*> *)&prev,(option *)name.second);
    local_98 = std::
               map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
               ::operator[](__return_storage_ptr__,
                            (not_null<const_pstore::command_line::option_*> *)&prev);
    bVar2 = small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
            ::empty(local_98);
    if (bVar2) {
LAB_0014c342:
      this_00 = local_98;
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_true>
                (&local_108,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                  *)local_78);
      small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
      ::push_back(this_00,&local_108);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~tuple(&local_108);
      local_dc = 0;
    }
    else {
      prev_string = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
                    ::back(local_98);
      prev_code_points =
           (unsigned_long *)
           std::get<std::__cxx11::string,std::__cxx11::string,unsigned_long>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                       *)prev_string);
      local_b8 = std::get<unsigned_long,std::__cxx11::string,unsigned_long>
                           ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                             *)prev_string);
      uVar1 = *local_b8;
      puVar4 = std::get<unsigned_long,std::__cxx11::string>
                         ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                           *)local_78);
      if (0x14 < uVar1 + 2 + *puVar4) goto LAB_0014c342;
      std::get<std::__cxx11::string,unsigned_long>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                  *)local_78);
      std::operator+((char *)local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&separator_len + 5));
      std::__cxx11::string::operator+=((string *)prev_code_points,local_d8);
      std::__cxx11::string::~string(local_d8);
      puVar4 = std::get<unsigned_long,std::__cxx11::string>
                         ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                           *)local_78);
      *local_b8 = *puVar4 + 2 + *local_b8;
      sVar3 = utf::length((string *)prev_code_points);
      if (sVar3 != *local_b8) {
        assert_failed("pstore::utf::length (prev_string) == prev_code_points",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
                      ,0x9e);
      }
      local_dc = 3;
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
             *)local_78);
    std::_Rb_tree_const_iterator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

auto get_switch_strings (options_set const & ops) -> switch_strings {
                    constexpr char const separator[] = ", ";
                    constexpr auto separator_len = array_elements (separator) - 1U;

                    switch_strings names;
                    for (option const * op : ops) {
                        std::pair<std::string, std::size_t> name = option_string (*op);
                        PSTORE_ASSERT (pstore::utf::length (std::get<std::string> (name)) ==
                                       std::get<std::size_t> (name));

                        if (alias const * const alias = op->as_alias ()) {
                            op = alias->original ();
                        }

                        auto & v = names[op];
                        if (!v.empty ()) {
                            auto & prev = v.back ();
                            auto & prev_string = std::get<std::string> (prev);
                            auto & prev_code_points = std::get<std::size_t> (prev);

                            if (prev_code_points + separator_len + std::get<std::size_t> (name) <=
                                overlong_opt_max) {
                                // Fold this string onto the same output line as its predecessor.
                                prev_string += separator + std::get<std::string> (name);
                                prev_code_points += separator_len + std::get<std::size_t> (name);

                                PSTORE_ASSERT (pstore::utf::length (prev_string) ==
                                               prev_code_points);
                                continue;
                            }
                        }
                        v.push_back (name);
                    }
                    return names;
                }